

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetLatestDataFromThreadMTx(MT *pMT,MTDATA *pMTData)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  MTDATA *pMTData_local;
  MT *pMT_local;
  
  local_24 = 0;
  do {
    if ((MT *)addrsMT[local_24] == pMT) {
      EnterCriticalSection(MTCS + local_24);
      memcpy(pMTData,mtdataMT + local_24,0x130);
      iVar1 = resMT[local_24];
      LeaveCriticalSection(MTCS + local_24);
      return iVar1;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetLatestDataFromThreadMTx(MT* pMT, MTDATA* pMTData)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsMT[id] != pMT)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&MTCS[id]);
	*pMTData = mtdataMT[id];
	res = resMT[id];
	LeaveCriticalSection(&MTCS[id]);

	return res;
}